

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_pairing.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Base_pairing<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>
::_reduce(Base_pairing<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>
          *this)

{
  __node_base_ptr *this_00;
  Index *pIVar1;
  node_ptr plVar2;
  pointer pPVar3;
  Base_pairing<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>
  *pBVar4;
  Dimension DVar5;
  pointer pvVar6;
  Column *pCVar7;
  iterator iVar8;
  _Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false> _Var9;
  Column *source;
  Index *pIVar10;
  key_type *pkVar11;
  ulong uVar12;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *v;
  pointer this_01;
  Column_support *pCVar13;
  Index IVar14;
  Index columnIndex;
  long lVar15;
  Index i;
  Index pivotColumnNumber;
  ID_index pivot;
  int dim;
  Pos_index nullDeath;
  Base_pairing<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>
  *local_b8;
  vector<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>,std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>
  *local_b0;
  int local_a4;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  columnsByDim;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  negativeColumns;
  
  nullDeath = 0xffffffff;
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::_Hashtable(&negativeColumns._M_h,
               (ulong)(uint)this[1].super_type.map_._M_h._M_rehash_policy._M_max_load_factor,
               (hash<unsigned_int> *)&columnsByDim,(key_equal *)&dim,(allocator_type *)&i);
  dim = *(int *)&this[-1].barcode_.
                 super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(&columnsByDim,(long)dim + 1,(allocator_type *)&i);
  pvVar6 = columnsByDim.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = &this[-1].super_type.map_._M_h._M_single_bucket;
  for (this_01 = columnsByDim.
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_01 != pvVar6; this_01 = this_01 + 1
      ) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              (this_01,(ulong)(uint)this[1].super_type.map_._M_h._M_rehash_policy._M_max_load_factor
              );
  }
  for (i = 0; i < (uint)this[1].super_type.map_._M_h._M_rehash_policy._M_max_load_factor; i = i + 1)
  {
    lVar15 = (long)dim;
    DVar5 = Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>
            ::get_column_dimension
                      ((Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>
                        *)this_00,i);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
              (columnsByDim.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + (lVar15 - DVar5),&i);
  }
  local_b0 = (vector<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>,std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>
              *)&this->barcode_;
  pvVar6 = columnsByDim.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_b8 = this;
  do {
    pBVar4 = local_b8;
    if (pvVar6 == columnsByDim.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      __sort<__gnu_cxx::__normal_iterator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>*,std::vector<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>,std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Gudhi::persistence_matrix::Base_pairing<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,true>>>::_reduce()::_lambda(Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>const&,Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>const&)_1_>>
                ((local_b8->barcode_).
                 super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 (local_b8->barcode_).
                 super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      uVar12 = 0;
      while( true ) {
        i = (Index)uVar12;
        pPVar3 = (local_b8->barcode_).
                 super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if ((ulong)(((long)(local_b8->barcode_).
                           super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pPVar3) / 0xc) <=
            uVar12) break;
        pivot = pPVar3[uVar12].death;
        if (pivot != 0xffffffff) {
          std::
          _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
          ::_M_emplace<unsigned_int&,unsigned_int&>
                    ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                      *)&pBVar4->deathToBar_,&pivot,&i);
          uVar12 = (ulong)i;
        }
        uVar12 = (ulong)((int)uVar12 + 1);
      }
      local_b8->isReduced_ = true;
      std::
      vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ::~vector(&columnsByDim);
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable(&negativeColumns._M_h);
      return;
    }
    pIVar1 = (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (pIVar10 = (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                   .super__Vector_impl_data._M_start; pIVar10 != pIVar1; pIVar10 = pIVar10 + 1) {
      i = *pIVar10;
      pCVar7 = Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>
               ::get_column((Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>
                             *)this_00,i);
      pCVar13 = &pCVar7->column_;
      plVar2 = (pCVar7->column_).super_type.data_.root_plus_size_.m_header.super_node.next_;
      if (plVar2 == (node_ptr)0x0 || plVar2 == (node_ptr)pCVar13) {
        iVar8 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&negativeColumns._M_h,&i);
        if (iVar8.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
            _M_cur == (__node_type *)0x0) {
          std::
          vector<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>,std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>
          ::emplace_back<unsigned_int&,unsigned_int_const&,int&>(local_b0,&i,&nullDeath,&dim);
        }
      }
      else {
        pivot = *(ID_index *)
                 &(pCVar7->column_).super_type.data_.root_plus_size_.m_header.super_node.prev_[1].
                  next_;
        iVar8 = std::
                _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                ::find(&(this->idToPosition_)._M_h,&pivot);
        pkVar11 = (key_type *)
                  ((long)iVar8.
                         super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                         ._M_cur + 0xc);
        if (iVar8.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
            _M_cur == (__node_type *)0x0) {
          pkVar11 = &pivot;
        }
        pivotColumnNumber = *pkVar11;
        _Var9._M_cur = (__node_type *)
                       std::
                       _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       ::find(&negativeColumns._M_h,&pivotColumnNumber);
        while( true ) {
          IVar14 = 0xffffffff;
          columnIndex = IVar14;
          if (_Var9._M_cur != (__node_type *)0x0) {
            columnIndex = *(Index *)((long)&((_Var9._M_cur)->
                                            super__Hash_node_value<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                            ).
                                            super__Hash_node_value_base<std::pair<const_unsigned_int,_unsigned_int>_>
                                            ._M_storage._M_storage + 4);
          }
          if (pivot == 0xffffffff) {
            Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>
            ::clear(pCVar7);
            std::
            vector<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>,std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>
            ::emplace_back<unsigned_int&,unsigned_int_const&,int&>(local_b0,&i,&nullDeath,&dim);
            goto LAB_001561af;
          }
          if (columnIndex == 0xffffffff) break;
          source = Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>
                   ::get_column((Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>
                                 *)this_00,columnIndex);
          _add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,true>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,false,true,true,true>>>>
                    (source,pCVar7);
          plVar2 = (pCVar13->super_type).data_.root_plus_size_.m_header.super_node.next_;
          if (plVar2 != (node_ptr)pCVar13 && plVar2 != (node_ptr)0x0) {
            IVar14 = *(Index *)&(pCVar7->column_).super_type.data_.root_plus_size_.m_header.
                                super_node.prev_[1].next_;
          }
          pivot = IVar14;
          iVar8 = std::
                  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find(&(this->idToPosition_)._M_h,&pivot);
          pkVar11 = (key_type *)
                    ((long)iVar8.
                           super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                           ._M_cur + 0xc);
          if (iVar8.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>.
              _M_cur == (__node_type *)0x0) {
            pkVar11 = &pivot;
          }
          pivotColumnNumber = *pkVar11;
          _Var9._M_cur = (__node_type *)
                         std::
                         _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         ::find(&negativeColumns._M_h,&pivotColumnNumber);
        }
        std::
        _Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::_M_emplace<unsigned_int&,unsigned_int&>
                  ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)&negativeColumns,&pivotColumnNumber,&i);
        pCVar7 = Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>
                 ::get_column((Boundary_matrix<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>
                               *)this_00,pivotColumnNumber);
        Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Boundary_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_true,_true,_true>_>_>
        ::clear(pCVar7);
        local_a4 = dim + -1;
        std::
        vector<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>,std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>>>
        ::emplace_back<unsigned_int&,unsigned_int&,int>(local_b0,&pivotColumnNumber,&i,&local_a4);
      }
LAB_001561af:
    }
    dim = dim + -1;
    pvVar6 = pvVar6 + 1;
  } while( true );
}

Assistant:

inline void Base_pairing<Master_matrix>::_reduce() 
{
  constexpr const Pos_index nullDeath = Master_matrix::template get_null_value<Pos_index>();
  constexpr const Index nullIndex = Master_matrix::template get_null_value<Index>();

  std::unordered_map<Index, Index> negativeColumns(_matrix()->get_number_of_columns());

  auto dim = _matrix()->get_max_dimension();
  std::vector<std::vector<Index> > columnsByDim(dim + 1);
  for (auto& v : columnsByDim) v.reserve(_matrix()->get_number_of_columns());
  for (unsigned int i = 0; i < _matrix()->get_number_of_columns(); i++) {
    columnsByDim[dim - _matrix()->get_column_dimension(i)].push_back(i);
  }

  for (const auto& cols : columnsByDim) {
    for (Index i : cols) {
      auto& curr = _matrix()->get_column(i);
      if (curr.is_empty()) {
        if (negativeColumns.find(i) == negativeColumns.end()) {
          barcode_.emplace_back(i, nullDeath, dim);
        }
      } else {
        ID_index pivot = curr.get_pivot();
        auto it = idToPosition_.find(pivot);
        Index pivotColumnNumber = it == idToPosition_.end() ? pivot : it->second;
        auto itNeg = negativeColumns.find(pivotColumnNumber);
        Index pivotKiller = itNeg == negativeColumns.end() ? nullIndex : itNeg->second;

        while (pivot != Master_matrix::template get_null_value<ID_index>() &&
               pivotKiller != Master_matrix::template get_null_value<Index>()) {
          if constexpr (Master_matrix::Option_list::is_z2) {
            curr += _matrix()->get_column(pivotKiller);
          } else {
            auto& toadd = _matrix()->get_column(pivotKiller);
            typename Master_matrix::Element coef = toadd.get_pivot_value();
            auto& operators = _matrix()->colSettings_->operators;
            coef = operators.get_inverse(coef);
            operators.multiply_inplace(coef, operators.get_characteristic() - curr.get_pivot_value());
            curr.multiply_source_and_add(toadd, coef);
          }

          pivot = curr.get_pivot();
          it = idToPosition_.find(pivot);
          pivotColumnNumber = it == idToPosition_.end() ? pivot : it->second;
          itNeg = negativeColumns.find(pivotColumnNumber);
          pivotKiller = itNeg == negativeColumns.end() ? nullIndex : itNeg->second;
        }

        if (pivot != Master_matrix::template get_null_value<ID_index>()) {
          negativeColumns.emplace(pivotColumnNumber, i);
          _matrix()->get_column(pivotColumnNumber).clear();
          barcode_.emplace_back(pivotColumnNumber, i, dim - 1);
        } else {
          curr.clear();
          barcode_.emplace_back(i, nullDeath, dim);
        }
      }
    }
    --dim;
  }

  if constexpr (Master_matrix::Option_list::has_removable_columns) {
    // sort barcode by birth such that a removal is trivial
    std::sort(barcode_.begin(), barcode_.end(), [](const Bar& b1, const Bar& b2) { return b1.birth < b2.birth; });
    // map can only be constructed once barcode is sorted
    for (Index i = 0; i < barcode_.size(); ++i) {
      auto d = barcode_[i].death;
      if (d != Master_matrix::template get_null_value<Pos_index>()) {
        deathToBar_.emplace(d, i);
      }
    }
  }

  isReduced_ = true;
}